

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O2

bool clusterG(TSimilarityMap *sim,TKeyPressCollection *keyPresses)

{
  TValueCC TVar1;
  int iVar2;
  int iVar3;
  pointer psVar4;
  double dVar5;
  pointer pPVar6;
  pointer pPVar7;
  ulong uVar8;
  long lVar9;
  pointer pPVar10;
  pointer pPVar11;
  pointer pPVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  size_t __n;
  ulong uVar16;
  TValueCC *pTVar17;
  pointer pPVar18;
  int iVar19;
  pointer pPVar20;
  pointer pvVar21;
  TClusterId *pTVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  int iVar26;
  pointer __p;
  __normal_iterator<Pair_*,_std::vector<Pair,_std::allocator<Pair>_>_> __i;
  double dVar27;
  double dVar28;
  vector<Pair,_std::allocator<Pair>_> local_68;
  long local_50;
  TSimilarityMap *local_48;
  pointer local_40;
  ulong local_38;
  
  psVar4 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)psVar4) / 0x30;
  lVar9 = 0;
  iVar26 = (int)uVar8;
  local_38 = 0;
  if (0 < iVar26) {
    local_38 = uVar8 & 0xffffffff;
  }
  local_50 = local_38 * 0x30;
  iVar14 = 1;
  for (; local_50 - lVar9 != 0; lVar9 = lVar9 + 0x30) {
    *(int *)((long)&psVar4->cid + lVar9) = iVar14;
    iVar14 = iVar14 + 1;
  }
  local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar14 = 1;
  if (1 < iVar26) {
    iVar14 = iVar26;
  }
  lVar9 = 1;
  pPVar18 = (pointer)0x0;
  pPVar10 = (pointer)0x0;
  __n = 0;
  local_48 = sim;
  do {
    pPVar20 = local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (__n == iVar14 - 1) {
      if (local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
          _M_start != pPVar10) {
        lVar25 = (long)pPVar10 -
                 (long)local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                       super__Vector_impl_data._M_start;
        uVar16 = lVar25 >> 4;
        lVar9 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                  (local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.
                   super__Vector_impl_data._M_start,pPVar10,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar25 < 0x101) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar20,pPVar10);
        }
        else {
          pPVar18 = pPVar20 + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (pPVar20,pPVar18);
          for (; pPVar18 != pPVar10; pPVar18 = pPVar18 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair*,std::vector<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair,std::allocator<clusterG(std::vector<std::vector<stMatch,std::allocator<stMatch>>,std::allocator<std::vector<stMatch,std::allocator<stMatch>>>>const&,stKeyPressCollection<short>&)::Pair>>>,__gnu_cxx::__ops::_Val_less_iter>
                      (pPVar18);
          }
        }
      }
      puts("[+] Top 10 pairs");
      pTVar17 = &pPVar20->cc;
      for (uVar16 = 0; uVar16 != 10; uVar16 = uVar16 + 1) {
        printf("    Pair %d: %d %d %g\n",SUB84(*pTVar17,0),uVar16 & 0xffffffff,
               (ulong)(uint)((Pair *)(pTVar17 + -1))->i,(ulong)(uint)*(int *)((long)pTVar17 + -4));
        pTVar17 = pTVar17 + 2;
      }
      uVar16 = (ulong)((long)pPVar10 - (long)pPVar20) >> 4;
      uVar24 = uVar16 & 0xffffffff;
      if ((int)uVar16 < 1) {
        uVar24 = 0;
      }
      uVar16 = 0;
      while ((uVar16 != uVar24 && (0.5 < pPVar20[uVar16].cc || pPVar20[uVar16].cc == 0.5))) {
        pPVar18 = pPVar20 + uVar16;
        psVar4 = (keyPresses->
                 super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                 super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar26 = psVar4[pPVar18->i].cid;
        iVar14 = psVar4[pPVar18->j].cid;
        if (iVar26 != iVar14) {
          dVar5 = 0.0;
          lVar9 = 0;
          iVar19 = 0;
          iVar15 = 0;
          iVar13 = 0;
          dVar27 = 0.0;
          dVar28 = 0.0;
          for (uVar23 = 0; uVar23 != local_38; uVar23 = uVar23 + 1) {
            iVar2 = psVar4[uVar23].cid;
            pvVar21 = (local_48->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar23;
            pTVar22 = &psVar4->cid;
            for (lVar25 = 0; (uVar8 & 0xffffffff) << 4 != lVar25; lVar25 = lVar25 + 0x10) {
              if (lVar9 != lVar25) {
                iVar3 = *pTVar22;
                if ((iVar2 == iVar14 || iVar2 == iVar26) && ((iVar3 == iVar26 || (iVar3 == iVar14)))
                   ) {
                  dVar5 = dVar5 + *(double *)
                                   (*(long *)&(pvVar21->
                                              super__Vector_base<stMatch,_std::allocator<stMatch>_>)
                                              ._M_impl.super__Vector_impl_data + lVar25);
                  iVar19 = iVar19 + 1;
                }
                if (iVar3 == iVar26 && iVar2 == iVar26) {
                  dVar27 = dVar27 + *(double *)
                                     (*(long *)&(pvVar21->
                                                super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                )._M_impl.super__Vector_impl_data + lVar25);
                  iVar15 = iVar15 + 1;
                }
                if (iVar3 == iVar14 && iVar2 == iVar14) {
                  dVar28 = dVar28 + *(double *)
                                     (*(long *)&(pvVar21->
                                                super__Vector_base<stMatch,_std::allocator<stMatch>_>
                                                )._M_impl.super__Vector_impl_data + lVar25);
                  iVar13 = iVar13 + 1;
                }
              }
              pTVar22 = pTVar22 + 0xc;
            }
            lVar9 = lVar9 + 0x10;
          }
          iVar2 = iVar26;
          if (iVar14 < iVar26) {
            iVar2 = iVar14;
          }
          if (0 < iVar15) {
            dVar27 = dVar27 / (double)iVar15;
          }
          if (0 < iVar13) {
            dVar28 = dVar28 / (double)iVar13;
          }
          local_40 = pPVar18;
          printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n");
          if ((dVar27 + dVar28) * 0.4 < dVar5 / (double)iVar19) {
            psVar4 = (keyPresses->
                     super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
                     super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            for (lVar9 = 0; local_50 != lVar9; lVar9 = lVar9 + 0x30) {
              iVar13 = *(int *)((long)&psVar4->cid + lVar9);
              if ((iVar13 == iVar26) || (iVar13 == iVar14)) {
                *(int *)((long)&psVar4->cid + lVar9) = iVar2;
              }
            }
            printf("Clusters %3d %5.4f:",SUB84(local_40->cc,0));
            lVar9 = local_50;
            for (lVar25 = 0; lVar9 != lVar25; lVar25 = lVar25 + 0x30) {
              printf(" %3d",(ulong)*(uint *)((long)&((keyPresses->
                                                                                                          
                                                  super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ).
                                                  super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->cid +
                                            lVar25));
            }
            putchar(10);
          }
        }
        uVar16 = uVar16 + 1;
      }
      std::vector<Pair,_std::allocator<Pair>_>::~vector(&local_68);
      return true;
    }
    for (lVar25 = lVar9; iVar13 = (int)lVar25, iVar13 < iVar26; lVar25 = lVar25 + 1) {
      TVar1 = *(TValueCC *)
               (*(long *)&(local_48->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[__n].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data + lVar25 * 0x10);
      if (pPVar10 == pPVar18) {
        if ((long)pPVar18 - (long)pPVar20 == 0x7ffffffffffffff0) {
          local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
          _M_start = pPVar20;
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)pPVar18 - (long)pPVar20 >> 4);
        pPVar10 = __p;
        if (pPVar18 == pPVar20) {
          pPVar10 = (pointer)0x1;
        }
        uVar16 = (long)&__p->i + (long)&pPVar10->i;
        if (0x7fffffffffffffe < uVar16) {
          uVar16 = 0x7ffffffffffffff;
        }
        if (CARRY8((ulong)pPVar10,(ulong)__p)) {
          uVar16 = 0x7ffffffffffffff;
        }
        if (uVar16 == 0) {
          pPVar11 = (pointer)0x0;
        }
        else {
          pPVar11 = (pointer)operator_new(uVar16 << 4);
        }
        pPVar11[(long)__p].i = (int)__n;
        pPVar11[(long)__p].j = iVar13;
        pPVar11[(long)__p].cc = TVar1;
        pPVar6 = pPVar11;
        for (pPVar12 = pPVar20; pPVar10 = pPVar6 + 1, pPVar12 != pPVar18; pPVar12 = pPVar12 + 1) {
          iVar13 = pPVar12->j;
          pPVar7 = (pointer)pPVar12->cc;
          pPVar6->i = pPVar12->i;
          pPVar6->j = iVar13;
          pPVar6->cc = (TValueCC)pPVar7;
          pPVar6 = pPVar10;
        }
        std::_Vector_base<Pair,_std::allocator<Pair>_>::_M_deallocate
                  ((_Vector_base<Pair,_std::allocator<Pair>_> *)pPVar20,__p,__n);
        pPVar18 = pPVar11 + uVar16;
        local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pPVar18;
      }
      else {
        pPVar10->i = (int)__n;
        pPVar10->j = iVar13;
        pPVar10->cc = TVar1;
        pPVar10 = pPVar10 + 1;
        pPVar11 = pPVar20;
      }
      pPVar20 = pPVar11;
      local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
      _M_finish = pPVar10;
    }
    lVar9 = lVar9 + 1;
    __n = __n + 1;
    local_68.super__Vector_base<Pair,_std::allocator<Pair>_>._M_impl.super__Vector_impl_data.
    _M_start = pPVar20;
  } while( true );
}

Assistant:

bool clusterG(const TSimilarityMap & sim, TKeyPressCollection & keyPresses) {
    struct Pair {
        int i = -1;
        int j = -1;
        TValueCC cc = -1.0;

        bool operator < (const Pair & a) const { return cc > a.cc; }
    };

    int n = keyPresses.size();

    int nclusters = 0;
    for (int i = 0; i < n; ++i) {
        auto & ci = keyPresses[i].cid;

        ci = i + 1;
        ++nclusters;
    }

    std::vector<Pair> ccpairs;
    for (int i = 0; i < n - 1; ++i) {
        for (int j = i + 1; j < n; ++j) {
            auto & cc = sim[i][j].cc;

            ccpairs.emplace_back(Pair{i, j, cc});
        }
    }

    std::sort(ccpairs.begin(), ccpairs.end());

    printf("[+] Top 10 pairs\n");
    for (int i = 0; i < 10; ++i) {
        printf("    Pair %d: %d %d %g\n", i, ccpairs[i].i, ccpairs[i].j, ccpairs[i].cc);
    }

    int npairs = ccpairs.size();
    for (int ip = 0; ip < npairs; ++ip) {
        auto & curpair = ccpairs[ip];
        //if (frand() > curpair.cc) continue;
        if (curpair.cc < 0.50) break;

        auto ci = keyPresses[curpair.i].cid;
        auto cj = keyPresses[curpair.j].cid;

        if (ci == cj) continue;
        auto cnew = std::min(ci, cj);
        int nsum = 0;
        int nsumi = 0;
        int nsumj = 0;
        double sumcc = 0.0;
        double sumcci = 0.0;
        double sumccj = 0.0;
        for (int k = 0; k < n; ++k) {
            auto ck = keyPresses[k].cid;

            for (int q = 0; q < n; ++q) {
                if (q == k) continue;
                auto cq = keyPresses[q].cid;

                if ((ck == ci || ck == cj) && (cq == ci || cq == cj)) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcc += cc;
                    ++nsum;
                }
                if (ck == ci && cq == ci) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumcci += cc;
                    ++nsumi;
                }
                if (ck == cj && cq == cj) {
                    auto & cc     = sim[k][q].cc;
                    //auto & offset = sim[k][q].offset;

                    sumccj += cc;
                    ++nsumj;
                }
            }
        }
        sumcc /= nsum;
        if (nsumi > 0) sumcci /= nsumi;
        if (nsumj > 0) sumccj /= nsumj;
        printf("Merge avg n = %4d, cc = %8.5f, ni = %4d, cci = %8.5f, nj = %4d, ccj = %8.5f\n", nsum, sumcc, nsumi, sumcci, nsumj, sumccj);

        //if (sumcc < 1.000*curpair.cc) continue;
        //if (sumcc > 0.75*sumccj && sumcc > 0.75*sumcci) {
        if (sumcc > 0.4*(sumcci + sumccj)) {
        } else {
            continue;
        }

        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            if (ck == ci || ck == cj) ck = cnew;
        }
        --nclusters;

        printf("Clusters %3d %5.4f:", nclusters, curpair.cc);
        for (int k = 0; k < n; ++k) {
            auto & ck = keyPresses[k].cid;

            printf(" %3d", ck);
        }
        printf("\n");
    }

    return true;
}